

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDebugTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::anon_unknown_1::LogErrorCase::expectMessage
          (LogErrorCase *this,GLenum source,GLenum type)

{
  TestLog *pTVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TestError *this_00;
  allocator<char> local_1ed;
  int numMsg;
  MessageData lastMsg;
  int msgLen;
  uint uStack_1ac;
  ostringstream local_1a8 [376];
  long lVar4;
  
  iVar3 = (*((this->super_BaseCase).super_ErrorCase.super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar3);
  numMsg = 0;
  pTVar1 = ((this->super_BaseCase).super_ErrorCase.super_TestCase.super_TestCase.super_TestNode.
           m_testCtx)->m_log;
  lastMsg.message._M_dataplus._M_p = (pointer)&lastMsg.message.field_2;
  lastMsg.id.source = 0;
  lastMsg.id.type = 0;
  lastMsg.id.id = 0;
  lastMsg.severity = 0;
  lastMsg.message._M_string_length = 0;
  lastMsg.message.field_2._M_local_buf[0] = '\0';
  if (type != 0x1100 && source != 0x1100) {
    (**(code **)(lVar4 + 0x868))(0x9145,&numMsg);
    _msgLen = (pointer)pTVar1;
    if (numMsg != 0) {
      if (1 < numMsg) {
        (**(code **)(lVar4 + 0x7e0))(numMsg + -1,0,0,0,0,0,0,0);
      }
      _msgLen = (pointer)((ulong)uStack_1ac << 0x20);
      (**(code **)(lVar4 + 0x868))(0x8243,&msgLen);
      if (msgLen < 0) {
        this_00 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_00,"Negative message length","msgLen >= 0",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDebugTests.cpp"
                   ,0x316);
      }
      else {
        if ((uint)msgLen < 100000) {
          std::__cxx11::string::resize((ulong)&lastMsg.message);
          (**(code **)(lVar4 + 0x7e0))
                    (1,(ulong)_msgLen & 0xffffffff,&lastMsg,&lastMsg.id.type,&lastMsg.id.id,
                     &lastMsg.severity,&msgLen,lastMsg.message._M_dataplus._M_p);
          _msgLen = (pointer)pTVar1;
          std::__cxx11::ostringstream::ostringstream(local_1a8);
          std::operator<<((ostream *)local_1a8,"Driver says: \"");
          std::operator<<((ostream *)local_1a8,(string *)&lastMsg.message);
          std::operator<<((ostream *)local_1a8,"\"");
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)&msgLen,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(local_1a8);
          BaseCase::verifyMessage(&this->super_BaseCase,&lastMsg,source,type);
          iVar3 = (*((this->super_BaseCase).super_ErrorCase.super_TestCase.m_context)->m_renderCtx->
                    _vptr_RenderContext[3])();
          (**(code **)(CONCAT44(extraout_var_00,iVar3) + 0x800))();
          goto LAB_003ccf86;
        }
        this_00 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_00,"Excessively long message","msgLen < 100000",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDebugTests.cpp"
                   ,0x317);
      }
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    bVar2 = BaseCase::isDebugContext(&this->super_BaseCase);
    if (bVar2) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&msgLen,"Error was not reported as expected",&local_1ed);
      tcu::ResultCollector::addResult
                (&(this->super_BaseCase).m_results,QP_TEST_RESULT_FAIL,(string *)&msgLen);
      std::__cxx11::string::~string((string *)&msgLen);
      std::__cxx11::ostringstream::ostringstream(local_1a8);
      std::operator<<((ostream *)local_1a8,
                      "A message was expected but none was reported (empty message log)");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&msgLen,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&msgLen,"Verification accuracy is lacking without a debug context",
                 &local_1ed);
      tcu::ResultCollector::addResult
                (&(this->super_BaseCase).m_results,QP_TEST_RESULT_QUALITY_WARNING,(string *)&msgLen)
      ;
      std::__cxx11::string::~string((string *)&msgLen);
      std::__cxx11::ostringstream::ostringstream(local_1a8);
      std::operator<<((ostream *)local_1a8,
                      "A message was expected but none was reported (empty message log). Running without a debug context"
                     );
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&msgLen,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
    std::__cxx11::ostringstream::~ostringstream(local_1a8);
  }
LAB_003ccf86:
  std::__cxx11::string::~string((string *)&lastMsg.message);
  return;
}

Assistant:

void LogErrorCase::expectMessage (GLenum source, GLenum type)
{
	const glw::Functions&	gl			= m_context.getRenderContext().getFunctions();
	int						numMsg		= 0;
	TestLog&				log			= m_testCtx.getLog();
	MessageData				lastMsg;

	if (source == GL_DONT_CARE || type == GL_DONT_CARE)
		return;

	gl.getIntegerv(GL_DEBUG_LOGGED_MESSAGES, &numMsg);

	if (numMsg == 0)
	{
		if (isDebugContext())
		{
			m_results.addResult(QP_TEST_RESULT_FAIL, "Error was not reported as expected");
			log << TestLog::Message << "A message was expected but none was reported (empty message log)" << TestLog::EndMessage;
		}
		else
		{
			m_results.addResult(QP_TEST_RESULT_QUALITY_WARNING, "Verification accuracy is lacking without a debug context");
			log << TestLog::Message << "A message was expected but none was reported (empty message log). Running without a debug context" << TestLog::EndMessage;
		}
		return;
	}

	// There may be messages other than the error we are looking for in the log.
	// Strictly nothing prevents the implementation from producing more than the
	// required error from an API call with a defined error. however we assume that
	// since calls that produce an error should not change GL state the implementation
	// should have nothing else to report.
	if (numMsg > 1)
		gl.getDebugMessageLog(numMsg-1, 0, DE_NULL, DE_NULL, DE_NULL, DE_NULL, DE_NULL, DE_NULL); // Clear all but last

	{
		int  msgLen = 0;
		gl.getIntegerv(GL_DEBUG_NEXT_LOGGED_MESSAGE_LENGTH, &msgLen);

		TCU_CHECK_MSG(msgLen >= 0, "Negative message length");
		TCU_CHECK_MSG(msgLen < 100000, "Excessively long message");

		lastMsg.message.resize(msgLen);
		gl.getDebugMessageLog(1, msgLen, &lastMsg.id.source, &lastMsg.id.type, &lastMsg.id.id, &lastMsg.severity, &msgLen, &lastMsg.message[0]);
	}

	log << TestLog::Message << "Driver says: \"" << lastMsg.message << "\"" << TestLog::EndMessage;

	verifyMessage(lastMsg, source, type);

	// Reset error so that code afterwards (such as glu::ShaderProgram) doesn't break because of
	// lingering error state.
	m_context.getRenderContext().getFunctions().getError();
}